

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_id_range(REF_CELL ref_cell,REF_MPI ref_mpi,REF_INT *min_id,REF_INT *max_id)

{
  REF_STATUS RVar1;
  uint uVar2;
  REF_INT local_c4;
  REF_INT local_c0;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT global;
  REF_INT nodes [27];
  int local_34;
  REF_INT cell;
  REF_INT *max_id_local;
  REF_INT *min_id_local;
  REF_MPI ref_mpi_local;
  REF_CELL ref_cell_local;
  
  *min_id = 0x7fffffff;
  *max_id = -0x80000000;
  if (ref_cell->last_node_is_an_id == 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x43c,
           "ref_cell_id_range","cell does not have ids");
    return 1;
  }
  for (local_34 = 0; local_34 < ref_cell->max; local_34 = local_34 + 1) {
    RVar1 = ref_cell_nodes(ref_cell,local_34,&ref_private_macro_code_rss);
    if (RVar1 == 0) {
      if (*min_id < (&ref_private_macro_code_rss)[ref_cell->node_per]) {
        local_c0 = *min_id;
      }
      else {
        local_c0 = (&ref_private_macro_code_rss)[ref_cell->node_per];
      }
      *min_id = local_c0;
      if ((&ref_private_macro_code_rss)[ref_cell->node_per] < *max_id) {
        local_c4 = *max_id;
      }
      else {
        local_c4 = (&ref_private_macro_code_rss)[ref_cell->node_per];
      }
      *max_id = local_c4;
    }
  }
  if ((ref_mpi != (REF_MPI)0x0) && (1 < ref_mpi->n)) {
    uVar2 = ref_mpi_min(ref_mpi,min_id,&ref_private_macro_code_rss_1,1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x446,
             "ref_cell_id_range",(ulong)uVar2,"mpi min face");
      return uVar2;
    }
    uVar2 = ref_mpi_bcast(ref_mpi,&ref_private_macro_code_rss_1,1,1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x447,
             "ref_cell_id_range",(ulong)uVar2,"mpi min face");
      return uVar2;
    }
    *min_id = ref_private_macro_code_rss_1;
    uVar2 = ref_mpi_max(ref_mpi,max_id,&ref_private_macro_code_rss_1,1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x44a,
             "ref_cell_id_range",(ulong)uVar2,"mpi max face");
      return uVar2;
    }
    uVar2 = ref_mpi_bcast(ref_mpi,&ref_private_macro_code_rss_1,1,1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",1099,
             "ref_cell_id_range",(ulong)uVar2,"mpi max face");
      return uVar2;
    }
    *max_id = ref_private_macro_code_rss_1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_id_range(REF_CELL ref_cell, REF_MPI ref_mpi,
                                     REF_INT *min_id, REF_INT *max_id) {
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  *min_id = REF_INT_MAX;
  *max_id = REF_INT_MIN;

  RAS(ref_cell_last_node_is_an_id(ref_cell), "cell does not have ids");

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    *min_id = MIN(*min_id, nodes[ref_cell_id_index(ref_cell)]);
    *max_id = MAX(*max_id, nodes[ref_cell_id_index(ref_cell)]);
  }